

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

void parser_register_core_classes(gravity_parser_t *parser)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  gtoken_s token;
  gtoken_s token_00;
  char *identifier_00;
  gnode_t **ppgVar4;
  void *pvVar5;
  long local_c0;
  gnode_t *local_b8;
  size_t local_a8;
  gnode_t *local_a0;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  char *local_70;
  gnode_t *local_68;
  gnode_t *node;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  char *local_40;
  gnode_t *local_38;
  gnode_t *node_1;
  char *identifier;
  gnode_r *pgStack_20;
  uint32_t i;
  gnode_r *decls;
  char **list;
  gravity_parser_t *parser_local;
  
  list = (char **)parser;
  decls = (gnode_r *)gravity_core_identifiers();
  pgStack_20 = gnode_array_create();
  for (identifier._4_4_ = 0; (&decls->n)[identifier._4_4_] != 0;
      identifier._4_4_ = identifier._4_4_ + 1) {
    node_1 = (gnode_t *)(&decls->n)[identifier._4_4_];
    memset(&node,0,0x28);
    identifier_00 = string_dup((char *)node_1);
    if (*(long *)list[1] == 0) {
      local_a0 = (gnode_t *)0x0;
    }
    else {
      local_a0 = *(gnode_t **)(*(long *)(list[1] + 0x10) + (*(long *)list[1] + -1) * 8);
    }
    token.colno = (undefined4)uStack_58;
    token.position = uStack_58._4_4_;
    token._0_8_ = node;
    token.bytes = (undefined4)local_50;
    token.length = local_50._4_4_;
    token.fileid = (undefined4)uStack_48;
    token.builtin = uStack_48._4_4_;
    token.value = local_40;
    local_38 = gnode_variable_create
                         (token,identifier_00,(char *)0x0,(gnode_t *)0x0,local_a0,
                          (gnode_variable_decl_t *)0x0);
    if (pgStack_20->n == pgStack_20->m) {
      if (pgStack_20->m == 0) {
        local_a8 = 8;
      }
      else {
        local_a8 = pgStack_20->m << 1;
      }
      pgStack_20->m = local_a8;
      ppgVar4 = (gnode_t **)realloc(pgStack_20->p,pgStack_20->m << 3);
      pgStack_20->p = ppgVar4;
    }
    sVar1 = pgStack_20->n;
    pgStack_20->n = sVar1 + 1;
    pgStack_20->p[sVar1] = local_38;
  }
  memset(&local_90,0,0x28);
  if (*(long *)list[1] == 0) {
    local_b8 = (gnode_t *)0x0;
  }
  else {
    local_b8 = *(gnode_t **)(*(long *)(list[1] + 0x10) + (*(long *)list[1] + -1) * 8);
  }
  token_00.colno = (undefined4)uStack_88;
  token_00.position = uStack_88._4_4_;
  token_00.type = (undefined4)local_90;
  token_00.lineno = local_90._4_4_;
  token_00.bytes = (undefined4)local_80;
  token_00.length = local_80._4_4_;
  token_00.fileid = (undefined4)uStack_78;
  token_00.builtin = uStack_78._4_4_;
  token_00.value = local_70;
  local_68 = gnode_variable_decl_create
                       (token_00,TOK_KEY_VAR,TOK_EOF,TOK_KEY_EXTERN,pgStack_20,local_b8);
  if (*(long *)list[2] == *(long *)(list[2] + 8)) {
    if (*(long *)(list[2] + 8) == 0) {
      local_c0 = 8;
    }
    else {
      local_c0 = *(long *)(list[2] + 8) << 1;
    }
    *(long *)(list[2] + 8) = local_c0;
    pvVar5 = realloc(*(void **)(list[2] + 0x10),*(long *)(list[2] + 8) << 3);
    *(void **)(list[2] + 0x10) = pvVar5;
  }
  lVar2 = *(long *)(list[2] + 0x10);
  lVar3 = *(long *)list[2];
  *(long *)list[2] = lVar3 + 1;
  *(gnode_t **)(lVar2 + lVar3 * 8) = local_68;
  return;
}

Assistant:

static void parser_register_core_classes (gravity_parser_t *parser) {
    const char **list = gravity_core_identifiers();

    // for each core identifier create a dummy extern variable node
    gnode_r *decls = gnode_array_create();

    uint32_t i = 0;
    while (list[i]) {
        const char *identifier = list[i];
        gnode_t *node = gnode_variable_create(NO_TOKEN, string_dup(identifier), NULL, NULL, LAST_DECLARATION(), NULL);
        gnode_array_push(decls, node);
        ++i;
    }

    // register a variable declaration node in global statements
    gnode_t *node = gnode_variable_decl_create(NO_TOKEN, TOK_KEY_VAR, 0, TOK_KEY_EXTERN, decls, LAST_DECLARATION());;
    gnode_array_push(parser->statements, (gnode_t *)node);
}